

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

shared_ptr<kratos::BuiltInFunctionStmtBlock> __thiscall
kratos::Generator::builtin_function(Generator *this,string *func_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_bool>
  pVar1;
  shared_ptr<kratos::BuiltInFunctionStmtBlock> sVar2;
  Generator *local_38;
  uint local_30;
  undefined1 local_29;
  
  (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
  local_38 = (Generator *)func_name;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::BuiltInFunctionStmtBlock,std::allocator<kratos::BuiltInFunctionStmtBlock>,kratos::Generator*,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_IRNode).fn_name_ln,
             (BuiltInFunctionStmtBlock **)this,
             (allocator<kratos::BuiltInFunctionStmtBlock> *)&local_29,&local_38,in_RDX);
  std::__shared_ptr<kratos::BuiltInFunctionStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::BuiltInFunctionStmtBlock,kratos::BuiltInFunctionStmtBlock>
            ((__shared_ptr<kratos::BuiltInFunctionStmtBlock,(__gnu_cxx::_Lock_policy)2> *)this,
             (BuiltInFunctionStmtBlock *)(this->super_IRNode)._vptr_IRNode);
  local_30 = *(uint *)&func_name[0x1f]._M_dataplus._M_p;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
  ::_M_emplace_unique<unsigned_int,std::__cxx11::string_const&>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
              *)&func_name[0x1f]._M_string_length,&local_30,in_RDX);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::BuiltInFunctionStmtBlock>&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
                      *)(func_name[0x1d].field_2._M_local_buf + 8),in_RDX,
                     (shared_ptr<kratos::BuiltInFunctionStmtBlock> *)this);
  sVar2.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = pVar1._8_8_;
  sVar2.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::BuiltInFunctionStmtBlock>)
         sVar2.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BuiltInFunctionStmtBlock> Generator::builtin_function(
    const std::string &func_name) {
    auto p = std::make_shared<BuiltInFunctionStmtBlock>(this, func_name);
    func_index_.emplace(static_cast<uint32_t>(funcs_.size()), func_name);
    funcs_.emplace(func_name, p);
    return p;
}